

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

void __thiscall FString::StripLeft(FString *this)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  FStringData *pFVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  
  pcVar1 = this->Chars;
  uVar5 = (ulong)*(uint *)(pcVar1 + -0xc);
  if (uVar5 == 0) {
    return;
  }
  uVar6 = 0;
  do {
    iVar3 = isspace((uint)(byte)pcVar1[uVar6]);
    if (iVar3 == 0) {
      uVar7 = uVar6;
      if (uVar6 == 0) {
        return;
      }
      break;
    }
    uVar6 = uVar6 + 1;
    uVar7 = uVar5;
  } while (uVar5 != uVar6);
  if (*(int *)(pcVar1 + -4) < 2) {
    sVar8 = 0xffffffffffffffff;
    if (uVar7 <= uVar5) {
      sVar2 = 0;
      do {
        sVar8 = sVar2;
        this->Chars[sVar8] = this->Chars[uVar7 + sVar8];
        sVar2 = sVar8 + 1;
      } while (~uVar5 + uVar7 + sVar8 + 1 != 0);
    }
    ReallocBuffer(this,sVar8);
    return;
  }
  sVar8 = uVar5 - uVar7;
  pFVar4 = FStringData::Alloc(sVar8);
  this->Chars = (char *)(pFVar4 + 1);
  pFVar4->Len = (uint)sVar8;
  memcpy(pFVar4 + 1,pcVar1 + uVar7,sVar8);
  *(undefined1 *)((long)pFVar4 + sVar8 + 0xc) = 0;
  FStringData::Release((FStringData *)(pcVar1 + -0xc));
  return;
}

Assistant:

FString &FString::operator += (const FString &tail)
{
	size_t len1 = Len();
	size_t len2 = tail.Len();
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail);
	return *this;
}